

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_b64b0::readWriteTest
               (string *tempDir,int channelCount,int testTimes,Box2i *dataWindow,
               Box2i *displayWindow)

{
  ostream *poVar1;
  void *pvVar2;
  char *pcVar3;
  int in_EDX;
  int in_ESI;
  Compression compression;
  int compressionIndex;
  int i;
  string filename;
  Box2i *in_stack_00000720;
  Box2i *in_stack_00000728;
  undefined1 in_stack_00000737;
  Compression in_stack_00000738;
  int in_stack_0000073c;
  string *in_stack_00000740;
  undefined1 in_stack_0000074a;
  undefined1 in_stack_0000074b;
  int in_stack_0000074c;
  string *in_stack_00000750;
  string local_a0 [16];
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_70 [36];
  undefined4 local_4c;
  int local_48;
  int local_44;
  string local_40 [48];
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  poVar1 = std::operator<<(poVar1," channels ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," times.");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  for (local_44 = 0; local_44 < local_10; local_44 = local_44 + 1) {
    local_48 = local_44 % 3;
    if (local_48 == 0) {
      local_4c = 0;
    }
    else if (local_48 == 1) {
      local_4c = 1;
    }
    else if (local_48 == 2) {
      local_4c = 2;
    }
    std::__cxx11::string::string(local_70,local_40);
    generateRandomFile(in_stack_00000740,in_stack_0000073c,in_stack_00000738,(bool)in_stack_00000737
                       ,in_stack_00000728,in_stack_00000720);
    std::__cxx11::string::~string(local_70);
    readFile(in_stack_00000750,in_stack_0000074c,(bool)in_stack_0000074b,(bool)in_stack_0000074a);
    if (1 < local_c) {
      readFile(in_stack_00000750,in_stack_0000074c,(bool)in_stack_0000074b,(bool)in_stack_0000074a);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_a0,local_40);
    generateRandomFile(in_stack_00000740,in_stack_0000073c,in_stack_00000738,(bool)in_stack_00000737
                       ,in_stack_00000728,in_stack_00000720);
    std::__cxx11::string::~string(local_a0);
    readFile(in_stack_00000750,in_stack_0000074c,(bool)in_stack_0000074b,(bool)in_stack_0000074a);
    if (1 < local_c) {
      readFile(in_stack_00000750,in_stack_0000074c,(bool)in_stack_0000074b,(bool)in_stack_0000074a);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void
readWriteTest (
    const std::string& tempDir,
    int                channelCount,
    int                testTimes,
    const Box2i&       dataWindow,
    const Box2i&       displayWindow)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;

    std::string filename = tempDir + "imf_test_deep_scanline_basic.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (
            filename,
            channelCount,
            compression,
            false,
            dataWindow,
            displayWindow);
        readFile (filename, channelCount, false, false);
        if (channelCount > 1) readFile (filename, channelCount, false, true);
        remove (filename.c_str ());
        cout << endl << flush;

        generateRandomFile (
            filename,
            channelCount,
            compression,
            true,
            dataWindow,
            displayWindow);
        readFile (filename, channelCount, true, false);
        if (channelCount > 1) readFile (filename, channelCount, true, true);
        remove (filename.c_str ());
        cout << endl << flush;
    }
}